

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall
kj::MainBuilder::Impl::Impl
          (Impl *this,ProcessContext *context,StringPtr version,StringPtr briefDescription,
          StringPtr extendedDescription)

{
  _Rb_tree_header *p_Var1;
  
  this->context = context;
  (this->version).content.ptr = version.content.ptr;
  (this->version).content.size_ = version.content.size_;
  (this->briefDescription).content.ptr = briefDescription.content.ptr;
  (this->briefDescription).content.size_ = briefDescription.content.size_;
  (this->extendedDescription).content.ptr = extendedDescription.content.ptr;
  (this->extendedDescription).content.size_ = extendedDescription.content.size_;
  Arena::Arena(&this->arena,0x400);
  p_Var1 = &(this->shortOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->longOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->longOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->longOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->longOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->longOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->longOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->subCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->subCommands)._M_t._M_impl.super__Rb_tree_header;
  (this->subCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->args).builder.ptr = (Arg *)0x0;
  (this->args).builder.pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
  (this->args).builder.endPtr = (Arg *)0x0;
  (this->args).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  (this->finalCallback).ptr.isSet = false;
  return;
}

Assistant:

inline Impl(ProcessContext& context, StringPtr version,
              StringPtr briefDescription, StringPtr extendedDescription)
      : context(context), version(version),
        briefDescription(briefDescription), extendedDescription(extendedDescription) {}